

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int set_dist_point_name(DIST_POINT_NAME **pdp,X509V3_CTX *ctx,CONF_VALUE *cnf)

{
  int iVar1;
  stack_st_CONF_VALUE *dn_sk;
  X509_NAME *nm_00;
  size_t sVar2;
  X509_NAME_ENTRY *pXVar3;
  DIST_POINT_NAME *pDVar4;
  int ret;
  X509_NAME *nm;
  stack_st_CONF_VALUE *dnsect;
  stack_st_X509_NAME_ENTRY *rnm;
  stack_st_GENERAL_NAME *fnm;
  CONF_VALUE *cnf_local;
  X509V3_CTX *ctx_local;
  DIST_POINT_NAME **pdp_local;
  
  rnm = (stack_st_X509_NAME_ENTRY *)0x0;
  dnsect = (stack_st_CONF_VALUE *)0x0;
  iVar1 = strncmp(cnf->name,"fullname",9);
  if (iVar1 == 0) {
    if (cnf->value == (char *)0x0) {
      ERR_put_error(0x14,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,100);
      return -1;
    }
    rnm = (stack_st_X509_NAME_ENTRY *)gnames_from_sectname(ctx,cnf->value);
    if (rnm == (stack_st_X509_NAME_ENTRY *)0x0) goto LAB_004b0288;
  }
  else {
    iVar1 = strcmp(cnf->name,"relativename");
    if (iVar1 != 0) {
      return 0;
    }
    if (cnf->value == (char *)0x0) {
      ERR_put_error(0x14,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,0x6f);
      return -1;
    }
    dn_sk = X509V3_get_section((X509V3_CTX *)ctx,cnf->value);
    if (dn_sk == (stack_st_CONF_VALUE *)0x0) {
      ERR_put_error(0x14,0,0x99,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,0x74);
      return -1;
    }
    nm_00 = X509_NAME_new();
    if (nm_00 == (X509_NAME *)0x0) {
      return -1;
    }
    iVar1 = X509V3_NAME_from_section(nm_00,dn_sk,0x1001);
    dnsect = (stack_st_CONF_VALUE *)nm_00->entries;
    nm_00->entries = (stack_st_X509_NAME_ENTRY *)0x0;
    X509_NAME_free(nm_00);
    if ((iVar1 == 0) ||
       (sVar2 = sk_X509_NAME_ENTRY_num((stack_st_X509_NAME_ENTRY *)dnsect), sVar2 == 0))
    goto LAB_004b0288;
    sVar2 = sk_X509_NAME_ENTRY_num((stack_st_X509_NAME_ENTRY *)dnsect);
    pXVar3 = sk_X509_NAME_ENTRY_value((stack_st_X509_NAME_ENTRY *)dnsect,sVar2 - 1);
    if (pXVar3->set != 0) {
      ERR_put_error(0x14,0,0x7a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,0x84);
      goto LAB_004b0288;
    }
  }
  if (*pdp == (DIST_POINT_NAME *)0x0) {
    pDVar4 = (DIST_POINT_NAME *)DIST_POINT_NAME_new();
    *pdp = pDVar4;
    if (*pdp != (DIST_POINT_NAME *)0x0) {
      if (rnm == (stack_st_X509_NAME_ENTRY *)0x0) {
        (*pdp)->type = 1;
        ((*pdp)->name).fullname = (GENERAL_NAMES *)dnsect;
      }
      else {
        (*pdp)->type = 0;
        ((*pdp)->name).relativename = rnm;
      }
      return 1;
    }
  }
  else {
    ERR_put_error(0x14,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0x8c);
  }
LAB_004b0288:
  sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)rnm,GENERAL_NAME_free);
  sk_X509_NAME_ENTRY_pop_free((stack_st_X509_NAME_ENTRY *)dnsect,X509_NAME_ENTRY_free);
  return -1;
}

Assistant:

static int set_dist_point_name(DIST_POINT_NAME **pdp, const X509V3_CTX *ctx,
                               const CONF_VALUE *cnf) {
  STACK_OF(GENERAL_NAME) *fnm = NULL;
  STACK_OF(X509_NAME_ENTRY) *rnm = NULL;
  if (!strncmp(cnf->name, "fullname", 9)) {
    // If |cnf| comes from |X509V3_parse_list|, which is possible for a v2i
    // function, |cnf->value| may be NULL.
    if (cnf->value == NULL) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
      return -1;
    }
    fnm = gnames_from_sectname(ctx, cnf->value);
    if (!fnm) {
      goto err;
    }
  } else if (!strcmp(cnf->name, "relativename")) {
    // If |cnf| comes from |X509V3_parse_list|, which is possible for a v2i
    // function, |cnf->value| may be NULL.
    if (cnf->value == NULL) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
      return -1;
    }
    const STACK_OF(CONF_VALUE) *dnsect = X509V3_get_section(ctx, cnf->value);
    if (!dnsect) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_SECTION_NOT_FOUND);
      return -1;
    }
    X509_NAME *nm = X509_NAME_new();
    if (!nm) {
      return -1;
    }
    int ret = X509V3_NAME_from_section(nm, dnsect, MBSTRING_ASC);
    rnm = nm->entries;
    nm->entries = NULL;
    X509_NAME_free(nm);
    if (!ret || sk_X509_NAME_ENTRY_num(rnm) <= 0) {
      goto err;
    }
    // There can only be one RDN in nameRelativeToCRLIssuer.
    if (sk_X509_NAME_ENTRY_value(rnm, sk_X509_NAME_ENTRY_num(rnm) - 1)->set) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_MULTIPLE_RDNS);
      goto err;
    }
  } else {
    return 0;
  }

  if (*pdp) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_DISTPOINT_ALREADY_SET);
    goto err;
  }

  *pdp = DIST_POINT_NAME_new();
  if (!*pdp) {
    goto err;
  }
  if (fnm) {
    (*pdp)->type = 0;
    (*pdp)->name.fullname = fnm;
  } else {
    (*pdp)->type = 1;
    (*pdp)->name.relativename = rnm;
  }

  return 1;

err:
  sk_GENERAL_NAME_pop_free(fnm, GENERAL_NAME_free);
  sk_X509_NAME_ENTRY_pop_free(rnm, X509_NAME_ENTRY_free);
  return -1;
}